

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenscanner.cpp
# Opt level: O2

void __thiscall TokenScanner::~TokenScanner(TokenScanner *this)

{
  this->_vptr_TokenScanner = (_func_int **)&PTR__TokenScanner_0010eab8;
  if ((this->stringInputFlag == true) && (this->isp != (istream *)0x0)) {
    (**(code **)(*(long *)this->isp + 8))();
  }
  std::__cxx11::string::~string((string *)&this->wordChars);
  std::__cxx11::string::~string((string *)&this->buffer);
  return;
}

Assistant:

TokenScanner::~TokenScanner() {
   if (stringInputFlag) delete isp;
}